

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

void stbtt_GetScaledFontVMetrics
               (uchar *fontdata,int index,float size,float *ascent,float *descent,float *lineGap)

{
  int offset;
  float fVar1;
  int i_lineGap;
  int i_descent;
  int i_ascent;
  stbtt_fontinfo info;
  int local_dc;
  int local_d8;
  int local_d4;
  stbtt_fontinfo local_d0;
  
  offset = stbtt_GetFontOffsetForIndex(fontdata,index);
  stbtt_InitFont(&local_d0,fontdata,offset);
  if (size <= 0.0) {
    fVar1 = -size / (float)(ushort)(*(ushort *)(local_d0.data + (long)local_d0.head + 0x12) << 8 |
                                   *(ushort *)(local_d0.data + (long)local_d0.head + 0x12) >> 8);
  }
  else {
    fVar1 = stbtt_ScaleForPixelHeight(&local_d0,size);
  }
  stbtt_GetFontVMetrics(&local_d0,&local_d4,&local_d8,&local_dc);
  *ascent = (float)local_d4 * fVar1;
  *descent = (float)local_d8 * fVar1;
  *lineGap = (float)local_dc * fVar1;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetScaledFontVMetrics(const unsigned char *fontdata, int index, float size, float *ascent, float *descent, float *lineGap)
{
   int i_ascent, i_descent, i_lineGap;
   float scale;
   stbtt_fontinfo info;
   stbtt_InitFont(&info, fontdata, stbtt_GetFontOffsetForIndex(fontdata, index));
   scale = size > 0 ? stbtt_ScaleForPixelHeight(&info, size) : stbtt_ScaleForMappingEmToPixels(&info, -size);
   stbtt_GetFontVMetrics(&info, &i_ascent, &i_descent, &i_lineGap);
   *ascent  = (float) i_ascent  * scale;
   *descent = (float) i_descent * scale;
   *lineGap = (float) i_lineGap * scale;
}